

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

bool __thiscall
btSingleContactCallback::process(btSingleContactCallback *this,btBroadphaseProxy *proxy)

{
  btCollisionObject *pbVar1;
  int iVar2;
  btBroadphaseProxy *pbVar3;
  ulong uVar4;
  btCollisionShape *pbVar5;
  btTransform *pbVar6;
  btDispatcher *pbVar7;
  undefined4 extraout_var;
  btDispatcherInfo *pbVar8;
  undefined8 *in_RSI;
  long in_RDI;
  btBridgedManifoldResult contactPointResult;
  btCollisionAlgorithm *algorithm;
  btCollisionObjectWrapper ob1;
  btCollisionObjectWrapper ob0;
  btCollisionObject *collisionObject;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffeec;
  btCollisionObjectWrapper *in_stack_fffffffffffffef0;
  long *plVar10;
  btCollisionObjectWrapper *obj0Wrap;
  btBridgedManifoldResult *this_00;
  undefined1 local_b0 [56];
  long *local_78;
  undefined1 local_70 [80];
  btCollisionObject *local_20;
  
  local_20 = (btCollisionObject *)*in_RSI;
  if (local_20 != *(btCollisionObject **)(in_RDI + 8)) {
    plVar10 = *(long **)(in_RDI + 0x18);
    pbVar3 = btCollisionObject::getBroadphaseHandle(local_20);
    uVar4 = (**(code **)(*plVar10 + 0x10))(plVar10,pbVar3);
    if ((uVar4 & 1) != 0) {
      pbVar5 = btCollisionObject::getCollisionShape(*(btCollisionObject **)(in_RDI + 8));
      pbVar1 = *(btCollisionObject **)(in_RDI + 8);
      pbVar6 = btCollisionObject::getWorldTransform(*(btCollisionObject **)(in_RDI + 8));
      btCollisionObjectWrapper::btCollisionObjectWrapper
                ((btCollisionObjectWrapper *)(local_70 + 0x28),(btCollisionObjectWrapper *)0x0,
                 pbVar5,pbVar1,pbVar6,-1,-1);
      pbVar5 = btCollisionObject::getCollisionShape(local_20);
      pbVar1 = local_20;
      pbVar6 = btCollisionObject::getWorldTransform(local_20);
      uVar9 = 0xffffffff;
      btCollisionObjectWrapper::btCollisionObjectWrapper
                ((btCollisionObjectWrapper *)local_70,(btCollisionObjectWrapper *)0x0,pbVar5,pbVar1,
                 pbVar6,-1,-1);
      pbVar7 = btCollisionWorld::getDispatcher(*(btCollisionWorld **)(in_RDI + 0x10));
      iVar2 = (*pbVar7->_vptr_btDispatcher[2])(pbVar7,local_70 + 0x28,local_70,0);
      local_78 = (long *)CONCAT44(extraout_var,iVar2);
      if (local_78 != (long *)0x0) {
        obj0Wrap = (btCollisionObjectWrapper *)(local_70 + 0x28);
        this_00 = (btBridgedManifoldResult *)local_70;
        btBridgedManifoldResult::btBridgedManifoldResult
                  (this_00,obj0Wrap,in_stack_fffffffffffffef0,
                   (ContactResultCallback *)CONCAT44(in_stack_fffffffffffffeec,uVar9));
        plVar10 = local_78;
        pbVar8 = btCollisionWorld::getDispatchInfo(*(btCollisionWorld **)(in_RDI + 0x10));
        (**(code **)(*plVar10 + 0x10))(plVar10,obj0Wrap,this_00,pbVar8,local_b0);
        (**(code **)*local_78)();
        pbVar7 = btCollisionWorld::getDispatcher(*(btCollisionWorld **)(in_RDI + 0x10));
        (*pbVar7->_vptr_btDispatcher[0xf])(pbVar7,local_78);
        btBridgedManifoldResult::~btBridgedManifoldResult((btBridgedManifoldResult *)0x182400);
      }
    }
  }
  return true;
}

Assistant:

virtual bool	process(const btBroadphaseProxy* proxy)
	{
		btCollisionObject*	collisionObject = (btCollisionObject*)proxy->m_clientObject;
		if (collisionObject == m_collisionObject)
			return true;

		//only perform raycast if filterMask matches
		if(m_resultCallback.needsCollision(collisionObject->getBroadphaseHandle())) 
		{
			btCollisionObjectWrapper ob0(0,m_collisionObject->getCollisionShape(),m_collisionObject,m_collisionObject->getWorldTransform(),-1,-1);
			btCollisionObjectWrapper ob1(0,collisionObject->getCollisionShape(),collisionObject,collisionObject->getWorldTransform(),-1,-1);

			btCollisionAlgorithm* algorithm = m_world->getDispatcher()->findAlgorithm(&ob0,&ob1);
			if (algorithm)
			{
				btBridgedManifoldResult contactPointResult(&ob0,&ob1, m_resultCallback);
				//discrete collision detection query
				
				algorithm->processCollision(&ob0,&ob1, m_world->getDispatchInfo(),&contactPointResult);

				algorithm->~btCollisionAlgorithm();
				m_world->getDispatcher()->freeCollisionAlgorithm(algorithm);
			}
		}
		return true;
	}